

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::equalityRowAdditions<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt addedEqRow,
          HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *targetRows)

{
  HighsDataStack *this_00;
  int iVar1;
  int iVar2;
  pointer pNVar3;
  HighsInt *pHVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  double *pdVar8;
  double local_40;
  EqualityRowAdditions local_34;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  piVar7 = eqRowVec->nodeIndex;
  pdVar8 = eqRowVec->nodeValue;
  pHVar4 = eqRowVec->nodePositions;
  iVar1 = eqRowVec->len;
  iVar5 = 0;
  for (lVar6 = 0; (long)iVar1 * 4 != lVar6; lVar6 = lVar6 + 4) {
    iVar2 = *(int *)((long)pHVar4 + lVar6);
    iVar5 = iVar2 - iVar5;
    piVar7 = piVar7 + iVar5;
    pdVar8 = pdVar8 + iVar5;
    local_40 = *pdVar8;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->rowValues,
               (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar7,&local_40);
    iVar5 = iVar2;
  }
  this_00 = &this->reductionValues;
  local_34.addedEqRow =
       (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[addedEqRow];
  HighsDataStack::push<presolve::HighsPostsolveStack::EqualityRowAdditions,_0>(this_00,&local_34);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_00,&this->rowValues);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_00,targetRows);
  reductionAdded(this,kEqualityRowAdditions);
  return;
}

Assistant:

void equalityRowAdditions(HighsInt addedEqRow,
                            const HighsMatrixSlice<RowStorageFormat>& eqRowVec,
                            const std::vector<Nonzero>& targetRows) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAdditions{origRowIndex[addedEqRow]});
    reductionValues.push(rowValues);
    reductionValues.push(targetRows);
    reductionAdded(ReductionType::kEqualityRowAdditions);
  }